

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmprogrammetocsv.cpp
# Opt level: O2

void fmprogrammetocsv::doit(bool skipheader)

{
  size_t sVar1;
  undefined7 in_register_00000039;
  fm_programme q;
  
  if ((int)CONCAT71(in_register_00000039,skipheader) == 0) {
    puts("from_agg_id,level_id,to_agg_id");
  }
  sVar1 = fread(&q,0xc,1,_stdin);
  while (sVar1 != 0) {
    printf("%d, %d, %d\n",(ulong)(uint)q.from_agg_id,(ulong)(uint)q.level_id,
           (ulong)(uint)q.to_agg_id);
    sVar1 = fread(&q,0xc,1,_stdin);
  }
  return;
}

Assistant:

void doit(bool skipheader) {
        if (skipheader == false)
            printf("from_agg_id,level_id,to_agg_id\n");

        fm_programme q;
        size_t i = fread(&q, sizeof(q), 1, stdin);
        while (i != 0) {
            printf("%d, %d, %d\n", q.from_agg_id, q.level_id, q.to_agg_id);
            i = fread(&q, sizeof(q), 1, stdin);
        }
    }